

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FormatterATT.c
# Opt level: O3

ZyanStatus
ZydisFormatterATTFormatInstruction
          (ZydisFormatter *formatter,ZydisFormatterBuffer *buffer,ZydisFormatterContext *context)

{
  void **ppvVar1;
  char cVar2;
  int iVar3;
  ZydisDecodedOperand *pZVar4;
  ZyanUSize ZVar5;
  ZyanAllocator *pZVar6;
  void *pvVar7;
  bool bVar8;
  ZyanStatus ZVar9;
  ZyanUSize len;
  void *pvVar10;
  ZydisFormatterFunc *pp_Var11;
  byte bVar12;
  ZydisDecorator ZVar13;
  long lVar14;
  ulong uVar15;
  ulong uVar16;
  long lVar17;
  void *pvVar18;
  
  if (formatter == (ZydisFormatter *)0x0) {
    __assert_fail("formatter",
                  "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/src/FormatterATT.c"
                  ,0x2e,
                  "ZyanStatus ZydisFormatterATTFormatInstruction(const ZydisFormatter *, ZydisFormatterBuffer *, ZydisFormatterContext *)"
                 );
  }
  if (buffer == (ZydisFormatterBuffer *)0x0) {
    __assert_fail("buffer",
                  "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/src/FormatterATT.c"
                  ,0x2f,
                  "ZyanStatus ZydisFormatterATTFormatInstruction(const ZydisFormatter *, ZydisFormatterBuffer *, ZydisFormatterContext *)"
                 );
  }
  if (context == (ZydisFormatterContext *)0x0) {
    __assert_fail("context",
                  "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/src/FormatterATT.c"
                  ,0x30,
                  "ZyanStatus ZydisFormatterATTFormatInstruction(const ZydisFormatter *, ZydisFormatterBuffer *, ZydisFormatterContext *)"
                 );
  }
  if (context->instruction == (ZydisDecodedInstruction *)0x0) {
    __assert_fail("context->instruction",
                  "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/src/FormatterATT.c"
                  ,0x31,
                  "ZyanStatus ZydisFormatterATTFormatInstruction(const ZydisFormatter *, ZydisFormatterBuffer *, ZydisFormatterContext *)"
                 );
  }
  if (context->operands == (ZydisDecodedOperand *)0x0) {
    __assert_fail("context->operands",
                  "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/src/FormatterATT.c"
                  ,0x32,
                  "ZyanStatus ZydisFormatterATTFormatInstruction(const ZydisFormatter *, ZydisFormatterBuffer *, ZydisFormatterContext *)"
                 );
  }
  ZVar9 = (*formatter->func_print_prefixes)(formatter,buffer,context);
  if ((-1 < (int)ZVar9) &&
     (ZVar9 = (*formatter->func_print_mnemonic)(formatter,buffer,context), -1 < (int)ZVar9)) {
    if (buffer->is_token_list == '\0') {
      pvVar10 = (void *)(buffer->string).vector.size;
    }
    else {
      pvVar10 = (buffer->string).vector.data;
    }
    bVar12 = context->instruction->operand_count_visible - 1;
    ZVar9 = 0x100000;
    if (-1 < (char)bVar12) {
      lVar17 = (ulong)bVar12 * 0x50;
      uVar16 = (ulong)bVar12 + 1;
      do {
        pZVar4 = context->operands;
        if (((uVar16 == 2) && (*(int *)((long)&pZVar4->type + lVar17) == 1)) &&
           (*(int *)((long)&pZVar4->encoding + lVar17) == 6)) goto LAB_0011576e;
        if (buffer->is_token_list == '\0') {
          pZVar6 = (buffer->string).vector.allocator;
          pvVar18 = (void *)(buffer->string).vector.size;
          if (pvVar18 == pvVar10) {
            if (pZVar6 != (ZyanAllocator *)0x0) {
LAB_001159b7:
              __assert_fail("!destination->vector.allocator",
                            "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/include/Zydis/Internal/String.h"
                            ,0xeb,
                            "ZyanStatus ZydisStringAppendShort(ZyanString *, const ZydisShortString *)"
                           );
            }
            if (pvVar10 == (void *)0x0) {
LAB_001159d6:
              __assert_fail("destination->vector.size && source->size",
                            "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/include/Zydis/Internal/String.h"
                            ,0xec,
                            "ZyanStatus ZydisStringAppendShort(ZyanString *, const ZydisShortString *)"
                           );
            }
            if ((buffer->string).vector.capacity < (long)pvVar10 + 1U) {
              return 0x80100009;
            }
            *(undefined2 *)((long)(buffer->string).vector.data + -1 + (long)pvVar10) = 0x20;
            ZVar5 = (buffer->string).vector.size;
            pvVar18 = (buffer->string).vector.data;
            (buffer->string).vector.size = ZVar5 + 1;
            cVar2 = *(char *)((long)pvVar18 + ZVar5);
            pvVar18 = pvVar10;
          }
          else {
            if (pZVar6 != (ZyanAllocator *)0x0) goto LAB_001159b7;
            if (pvVar18 == (void *)0x0) goto LAB_001159d6;
            if ((buffer->string).vector.capacity < (long)pvVar18 + 2U) {
              return 0x80100009;
            }
            pvVar7 = (buffer->string).vector.data;
            *(undefined1 *)((long)pvVar7 + 1 + (long)pvVar18) = 0;
            *(undefined2 *)((long)pvVar7 + -1 + (long)pvVar18) = 0x202c;
            ZVar5 = (buffer->string).vector.size;
            pvVar7 = (buffer->string).vector.data;
            (buffer->string).vector.size = ZVar5 + 2;
            cVar2 = *(char *)((long)pvVar7 + ZVar5 + 1);
          }
          if (cVar2 != '\0') {
            __assert_fail("*(char*)((ZyanU8*)(destination)->vector.data + (destination)->vector.size - 1) == \'\\0\'"
                          ,
                          "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/include/Zydis/Internal/String.h"
                          ,0xf7,
                          "ZyanStatus ZydisStringAppendShort(ZyanString *, const ZydisShortString *)"
                         );
          }
        }
        else {
          ZVar5 = (buffer->string).vector.size;
          pvVar18 = (buffer->string).vector.data;
          if (pvVar10 == pvVar18) {
            if (0xfe < ZVar5 - 1) {
LAB_001158fd:
              __assert_fail("(len > 0) && (len < 256)",
                            "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/include/Zydis/Internal/FormatterBase.h"
                            ,0xe7,
                            "ZyanStatus ZydisFormatterBufferAppendPredefined(ZydisFormatterBuffer *, const ZydisPredefinedToken *)"
                           );
            }
            if (buffer->capacity <= ZVar5 + 4) {
              return 0x80100009;
            }
            *(char *)((long)pvVar18 + -1) = (char)ZVar5;
            *(undefined4 *)((long)pvVar18 + ZVar5) = 0x200001;
            lVar14 = 2;
            pvVar18 = pvVar10;
          }
          else {
            if (0xfe < ZVar5 - 1) goto LAB_001158fd;
            if (buffer->capacity <= ZVar5 + 8) {
              return 0x80100009;
            }
            *(char *)((long)pvVar18 + -1) = (char)ZVar5;
            *(undefined8 *)((long)pvVar18 + ZVar5) = 0x200001002c0202;
            lVar14 = 6;
          }
          uVar15 = buffer->capacity - (ZVar5 + lVar14);
          buffer->capacity = uVar15;
          ppvVar1 = &(buffer->string).vector.data;
          *ppvVar1 = (void *)((long)*ppvVar1 + ZVar5 + lVar14);
          (buffer->string).vector.size = 2;
          if (0xfe < uVar15) {
            uVar15 = 0xff;
          }
          (buffer->string).vector.capacity = uVar15;
        }
        context->operand = (ZydisDecodedOperand *)(&pZVar4->id + lVar17);
        if (formatter->func_pre_operand == (ZydisFormatterFunc)0x0) {
LAB_001156e9:
          pp_Var11 = &formatter->func_format_operand_reg;
          switch(*(undefined4 *)((long)&pZVar4->type + lVar17)) {
          case 1:
            break;
          case 2:
            pp_Var11 = &formatter->func_format_operand_mem;
            break;
          case 3:
            pp_Var11 = &formatter->func_format_operand_ptr;
            break;
          case 4:
            pp_Var11 = &formatter->func_format_operand_imm;
            break;
          default:
            return 0x80100004;
          }
          ZVar9 = (**pp_Var11)(formatter,buffer,context);
          if (ZVar9 == 0x20000b) goto LAB_00115757;
          if ((int)ZVar9 < 0) {
            return ZVar9;
          }
          if (formatter->func_post_operand != (ZydisFormatterFunc)0x0) {
            ZVar9 = (*formatter->func_post_operand)(formatter,buffer,context);
            if (ZVar9 == 0x20000b) goto LAB_00115757;
            if (-1 < (int)ZVar9) {
              return ZVar9;
            }
          }
          if ((context->instruction->encoding & ~ZYDIS_INSTRUCTION_ENCODING_3DNOW) ==
              ZYDIS_INSTRUCTION_ENCODING_EVEX) {
            if (((uVar16 == 1) && (1 < context->instruction->operand_count_visible)) &&
               ((context->operands[1].encoding == ZYDIS_OPERAND_ENCODING_MASK &&
                (ZVar9 = (*formatter->func_print_decorator)
                                   (formatter,buffer,context,ZYDIS_DECORATOR_MASK), (int)ZVar9 < 0))
               )) {
              return ZVar9;
            }
            iVar3 = *(int *)((long)&pZVar4->type + lVar17);
            if (iVar3 != 2) {
              bVar12 = context->instruction->operand_count_visible;
              if ((int)uVar16 + -1 == bVar12 - 1) {
                if (iVar3 != 4) {
LAB_0011587d:
                  if ((context->instruction->encoding == ZYDIS_INSTRUCTION_ENCODING_MAX_VALUE) &&
                     (ZVar9 = (*formatter->func_print_decorator)
                                        (formatter,buffer,context,ZYDIS_DECORATOR_SWIZZLE),
                     (int)ZVar9 < 0)) {
                    return ZVar9;
                  }
                  ZVar9 = (*formatter->func_print_decorator)
                                    (formatter,buffer,context,ZYDIS_DECORATOR_RC);
                  if ((int)ZVar9 < 0) {
                    return ZVar9;
                  }
                  ZVar13 = ZYDIS_DECORATOR_SAE;
                  goto LAB_001158c6;
                }
              }
              else if ((int)uVar16 < (int)(uint)bVar12) {
                if ((context->operands[uVar16 & 0xffffffff].type == ZYDIS_OPERAND_TYPE_IMMEDIATE) ||
                   (context->operands[uVar16 & 0xffffffff].visibility ==
                    ZYDIS_OPERAND_VISIBILITY_HIDDEN)) goto LAB_0011587d;
              }
              goto LAB_0011576e;
            }
            ZVar9 = (*formatter->func_print_decorator)(formatter,buffer,context,ZYDIS_DECORATOR_BC);
            if ((int)ZVar9 < 0) {
              return ZVar9;
            }
            if (context->instruction->encoding != ZYDIS_INSTRUCTION_ENCODING_MAX_VALUE)
            goto LAB_0011576e;
            ZVar9 = (*formatter->func_print_decorator)
                              (formatter,buffer,context,ZYDIS_DECORATOR_CONVERSION);
            if ((int)ZVar9 < 0) {
              return ZVar9;
            }
            ZVar13 = ZYDIS_DECORATOR_EH;
LAB_001158c6:
            ZVar9 = (*formatter->func_print_decorator)(formatter,buffer,context,ZVar13);
            goto joined_r0x001158d3;
          }
        }
        else {
          ZVar9 = (*formatter->func_pre_operand)(formatter,buffer,context);
          if (ZVar9 != 0x20000b) {
            if ((int)ZVar9 < 0) {
              return ZVar9;
            }
            goto LAB_001156e9;
          }
LAB_00115757:
          ZVar9 = ZydisFormatterBufferRestore(buffer,(ZyanUPointer)pvVar18);
joined_r0x001158d3:
          if ((int)ZVar9 < 0) {
            return ZVar9;
          }
        }
LAB_0011576e:
        lVar17 = lVar17 + -0x50;
        uVar15 = uVar16 - 1;
        bVar8 = 0 < (long)uVar16;
        uVar16 = uVar15;
      } while (uVar15 != 0 && bVar8);
      ZVar9 = 0x100000;
    }
  }
  return ZVar9;
}

Assistant:

ZyanStatus ZydisFormatterATTFormatInstruction(const ZydisFormatter* formatter,
    ZydisFormatterBuffer* buffer, ZydisFormatterContext* context)
{
    ZYAN_ASSERT(formatter);
    ZYAN_ASSERT(buffer);
    ZYAN_ASSERT(context);
    ZYAN_ASSERT(context->instruction);
    ZYAN_ASSERT(context->operands);

    ZYAN_CHECK(formatter->func_print_prefixes(formatter, buffer, context));
    ZYAN_CHECK(formatter->func_print_mnemonic(formatter, buffer, context));

    ZyanUPointer state_mnemonic;
    ZYDIS_BUFFER_REMEMBER(buffer, state_mnemonic);

    const ZyanI8 c = (ZyanI8)context->instruction->operand_count_visible - 1;
    for (ZyanI8 i = c; i >= 0; --i)
    {
        const ZydisDecodedOperand* const operand = &context->operands[i];

        // Print embedded-mask registers as decorator instead of a regular operand
        if ((i == 1) && (operand->type == ZYDIS_OPERAND_TYPE_REGISTER) &&
            (operand->encoding == ZYDIS_OPERAND_ENCODING_MASK))
        {
            continue;
        }

        ZyanUPointer buffer_state;
        ZYDIS_BUFFER_REMEMBER(buffer, buffer_state);

        if (buffer_state != state_mnemonic)
        {
            ZYDIS_BUFFER_APPEND(buffer, DELIM_OPERAND);
        } else
        {
            ZYDIS_BUFFER_APPEND(buffer, DELIM_MNEMONIC);
        }

        // Set current operand
        context->operand = operand;

        ZyanStatus status;
        if (formatter->func_pre_operand)
        {
            status = formatter->func_pre_operand(formatter, buffer, context);
            if (status == ZYDIS_STATUS_SKIP_TOKEN)
            {
                ZYAN_CHECK(ZydisFormatterBufferRestore(buffer, buffer_state));
                continue;
            }
            if (!ZYAN_SUCCESS(status))
            {
                return status;
            }
        }

        switch (operand->type)
        {
        case ZYDIS_OPERAND_TYPE_REGISTER:
            status = formatter->func_format_operand_reg(formatter, buffer, context);
            break;
        case ZYDIS_OPERAND_TYPE_MEMORY:
            status = formatter->func_format_operand_mem(formatter, buffer, context);
            break;
        case ZYDIS_OPERAND_TYPE_POINTER:
            status = formatter->func_format_operand_ptr(formatter, buffer, context);
            break;
        case ZYDIS_OPERAND_TYPE_IMMEDIATE:
            status = formatter->func_format_operand_imm(formatter, buffer, context);
            break;
        default:
            return ZYAN_STATUS_INVALID_ARGUMENT;
        }
        if (status == ZYDIS_STATUS_SKIP_TOKEN)
        {
            ZYAN_CHECK(ZydisFormatterBufferRestore(buffer, buffer_state));
            continue;
        }
        if (!ZYAN_SUCCESS(status))
        {
            return status;
        }

        if (formatter->func_post_operand)
        {
            status = formatter->func_post_operand(formatter, buffer, context);
            if (status == ZYDIS_STATUS_SKIP_TOKEN)
            {
                ZYAN_CHECK(ZydisFormatterBufferRestore(buffer, buffer_state));
                continue;
            }
            if (ZYAN_SUCCESS(status))
            {
                return status;
            }
        }

#if !defined(ZYDIS_DISABLE_AVX512) || !defined(ZYDIS_DISABLE_KNC)
        if ((context->instruction->encoding == ZYDIS_INSTRUCTION_ENCODING_EVEX) ||
            (context->instruction->encoding == ZYDIS_INSTRUCTION_ENCODING_MVEX))
        {
            if  ((i == 0) && 
                (context->instruction->operand_count_visible > 1) && 
                (context->operands[1].encoding == ZYDIS_OPERAND_ENCODING_MASK))
            {
                ZYAN_CHECK(formatter->func_print_decorator(formatter, buffer, context,
                    ZYDIS_DECORATOR_MASK));
            }
            if (operand->type == ZYDIS_OPERAND_TYPE_MEMORY)
            {
                ZYAN_CHECK(formatter->func_print_decorator(formatter, buffer, context,
                    ZYDIS_DECORATOR_BC));
                if (context->instruction->encoding == ZYDIS_INSTRUCTION_ENCODING_MVEX)
                {
                    ZYAN_CHECK(formatter->func_print_decorator(formatter, buffer, context,
                        ZYDIS_DECORATOR_CONVERSION));
                    ZYAN_CHECK(formatter->func_print_decorator(formatter, buffer, context,
                        ZYDIS_DECORATOR_EH));
                }
            } else
            {
                ZyanBool decorate_operand;
                if (i == (context->instruction->operand_count_visible - 1))
                {
                    decorate_operand = operand->type != ZYDIS_OPERAND_TYPE_IMMEDIATE;
                }
                else
                {
                    decorate_operand =
                        (context->instruction->operand_count_visible > (i + 1)) &&
                        ((context->operands[i + 1].type == ZYDIS_OPERAND_TYPE_IMMEDIATE) ||
                        (context->operands[i + 1].visibility == ZYDIS_OPERAND_VISIBILITY_HIDDEN));
                }
                if (decorate_operand)
                {
                    if (context->instruction->encoding == ZYDIS_INSTRUCTION_ENCODING_MVEX)
                    {
                        ZYAN_CHECK(formatter->func_print_decorator(formatter, buffer, context,
                            ZYDIS_DECORATOR_SWIZZLE));
                    }
                    ZYAN_CHECK(formatter->func_print_decorator(formatter, buffer, context,
                        ZYDIS_DECORATOR_RC));
                    ZYAN_CHECK(formatter->func_print_decorator(formatter, buffer, context,
                        ZYDIS_DECORATOR_SAE));
                }
            }
        }
#endif
    }

    return ZYAN_STATUS_SUCCESS;
}